

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O0

span<const_char,__1L> __thiscall
pstore::gsl::span<const_char,_4L>::subspan
          (span<const_char,_4L> *this,index_type offset,index_type count)

{
  index_type iVar1;
  pointer peVar2;
  index_type local_58;
  index_type count_local;
  index_type offset_local;
  span<const_char,_4L> *this_local;
  
  if (((offset == 0) || ((0 < offset && (iVar1 = size(this), offset <= iVar1)))) &&
     ((count == -1 || ((-1 < count && (iVar1 = size(this), offset + count <= iVar1)))))) {
    peVar2 = data(this);
    local_58 = count;
    if (count == -1) {
      local_58 = size(this);
      local_58 = local_58 - offset;
    }
    span<const_char,_-1L>::span((span<const_char,__1L> *)&this_local,peVar2 + offset,local_58);
    return (span<const_char,__1L>)_this_local;
  }
  assert_failed("(offset == 0 || (offset > 0 && offset <= size ())) && (count == dynamic_extent || (count >= 0 && offset + count <= size ()))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x17b);
}

Assistant:

span<element_type, dynamic_extent>
            subspan (index_type const offset, index_type const count = dynamic_extent) const
                noexcept {
                PSTORE_ASSERT (
                    (offset == 0 || (offset > 0 && offset <= size ())) &&
                    (count == dynamic_extent || (count >= 0 && offset + count <= size ())));
                return {data () + offset, count == dynamic_extent ? size () - offset : count};
            }